

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

optional<unsigned_long> __thiscall kratos::Simulator::get_value_(Simulator *this,Var *var)

{
  uint *puVar1;
  _func_int **pp_Var2;
  pointer puVar3;
  Var *pVVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  undefined4 extraout_var;
  pair<unsigned_int,_unsigned_int> pVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  const_iterator cVar13;
  mapped_type *__x;
  InternalException *pIVar14;
  ulong uVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Storage<unsigned_long,_true> unaff_R14;
  optional<unsigned_long> oVar16;
  basic_string_view<char> bVar17;
  string_view format_str;
  format_args args;
  Var *local_a8;
  pointer ppStack_a0;
  undefined1 auStack_98 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  Var *local_78;
  Var *var_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  undefined1 local_50 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> result;
  Var *root;
  
  if (((var == (Var *)0x0) ||
      (puVar1 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start,
      (long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 != 4)) || (1 < *puVar1))
  goto LAB_001db24c;
  local_78 = var;
  switch(var->type_) {
  case Expression:
    eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_50,this
              ,var);
    if (result.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload.field2[0x10] == '\x01') {
      this = *(Simulator **)local_50;
      uVar15 = CONCAT71((int7)((ulong)var >> 8),1);
    }
    else {
      uVar15 = 0;
    }
    std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             local_50);
    goto LAB_001db24e;
  case Slice:
    iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
    result.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _24_8_ = CONCAT44(extraout_var,iVar8);
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_98 = (undefined1  [8])0x0;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if ((((Var *)result.
                 super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._24_8_)->type_ == Parameter) ||
       (((Var *)result.
                super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ._24_8_)->type_ == ConstValue)) {
      oVar16 = get_value_(this,var);
      local_50 = oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
      if (((undefined1  [16])
           oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        (*(var->super_IRNode)._vptr_IRNode[0x20])(&var_local,var);
        local_a8 = var_local;
        ppStack_a0 = index.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        bVar17 = fmt::v7::to_string_view<char,_0>("Unable to get value for {0}");
        format_str.data_ = (char *)bVar17.size_;
        format_str.size_ = 0xd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_a8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_50,(detail *)bVar17.data_,format_str,args);
        InternalException::InternalException(pIVar14,(string *)local_50);
        __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<unsigned_long_const*>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_98,local_50);
LAB_001db311:
      get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&var_local,this,var);
      if (var_local ==
          (Var *)index.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
        uVar15 = 0;
      }
      else {
        pVar10 = compute_var_high_low
                           ((Var *)result.
                                   super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   ._24_8_,
                            (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)&var_local);
        uVar7 = (**(code **)(*(long *)result.
                                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._24_8_ + 0x38))();
        if (uVar7 < (pVar10.first - pVar10.second) + 1) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_50,"Unable to resolve variable slicing",
                     (allocator<char> *)&local_a8);
          InternalException::InternalException(pIVar14,(string *)local_50);
          __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar7 = *(uint *)(result.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._24_8_ + 0x98);
        this = (Simulator *)
               (~(-1L << ((char)(((ulong)pVar10 & 0xffffffff) % (ulong)uVar7) + 1U & 0x3f)) &
               *(ulong *)((long)auStack_98 + (((ulong)pVar10 >> 0x20) / (ulong)uVar7) * 8) >>
               ((byte)(((ulong)pVar10 >> 0x20) % (ulong)uVar7) & 0x3f));
        uVar15 = CONCAT71(pVar10._1_7_,1);
      }
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&var_local);
    }
    else {
      puVar3 = (((Var *)result.
                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ._24_8_)->size_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((long)(((Var *)result.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._24_8_)->size_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar3 == 4) && (*puVar3 == 1)) {
        oVar16 = get_value_(this,(Var *)result.
                                        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        ._24_8_);
        if (((undefined1  [16])
             oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          local_50 = (undefined1  [8])
                     oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_assign_aux<unsigned_long_const*>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_98,local_50);
          goto LAB_001db311;
        }
      }
      else {
        cVar13 = std::
                 _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->complex_values_)._M_h,
                        (key_type *)
                        &result.
                         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_engaged);
        if (cVar13.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          __x = std::__detail::
                _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->complex_values_,
                     (key_type *)
                     &result.
                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._M_engaged);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_98,__x);
          goto LAB_001db311;
        }
      }
      uVar15 = 0;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_98);
    goto LAB_001db24e;
  case ConstValue:
    if (*(int *)&var[1].super_IRNode.comment._M_dataplus._M_p != 0) {
      pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
      (*(var->super_IRNode)._vptr_IRNode[0x1f])(&var_local,var);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "Big number evaluation not supported. Got ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var_local
                    );
      InternalException::InternalException(pIVar14,(string *)local_50);
      __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  case Parameter:
    this = (Simulator *)((_Storage<unsigned_long,_true> *)(var + 1))->_M_value;
    break;
  default:
    iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x1c])(var);
    unaff_R14 = (_Storage<unsigned_long,_true>)this;
    if ((char)iVar8 != '\0') {
      pp_Var2 = var[1].super_IRNode._vptr_IRNode;
      cVar5 = (**(code **)(*pp_Var2 + 0x80))(pp_Var2);
      if (cVar5 != '\0') {
        std::__cxx11::string::string((string *)local_50,(string *)(pp_Var2 + 0x1d));
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,"clog2");
        std::__cxx11::string::~string((string *)local_50);
        if (bVar6) {
          pVVar4 = var + 1;
          var = (Var *)local_50;
          std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)var,
                     (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     (*(long *)&(pVVar4->super_IRNode).verilog_ln + 0x40));
          oVar16 = get_value_(this,(Var *)local_50);
          if (((undefined1  [16])
               oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            uVar9 = clog2(oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._M_payload._0_4_);
            this._4_4_ = 0;
            this._0_4_ = uVar9;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result);
            break;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result);
        }
      }
LAB_001db24c:
      this = (Simulator *)unaff_R14;
      uVar15 = 0;
      goto LAB_001db24e;
    }
    cVar11 = std::
             _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this,&local_78);
    if (cVar11.super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) goto LAB_001db24c;
    pmVar12 = std::__detail::
              _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this,&local_78);
    this = (Simulator *)*pmVar12;
  }
  uVar15 = CONCAT71((int7)((ulong)var >> 8),1);
LAB_001db24e:
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar15 & 0xffffffff;
  oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)(_Storage<unsigned_long,_true>)this;
  return (optional<unsigned_long>)
         oVar16.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Simulator::get_value_(const kratos::Var *var) const {
    if (!var) return std::nullopt;
    // only scalar
    if (var->size().size() != 1 || var->size().front() > 1) return std::nullopt;

    if (var->type() == VarType::Parameter) {
        auto const *param = reinterpret_cast<const Param *>(var);
        return param->value();
    } else if (var->type() == VarType::ConstValue) {
        auto const *const_ = reinterpret_cast<const Const *>(var);
        if (const_->is_bignum())
            throw InternalException("Big number evaluation not supported. Got " +
                                    const_->to_string());
        return const_->value();
    } else if (var->type() == VarType::Expression) {
        auto result = eval_expr(var);
        if (result) {
            return (*result)[0];
        } else {
            return std::nullopt;
        }
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            auto value = get_value_(var);
            if (!value)
                throw InternalException(
                    ::format("Unable to get value for {0}", var->handle_name()));
            values = {*value};
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            auto value = get_value_(root);
            if (!value) return std::nullopt;
            values = {*value};
        } else if (complex_values_.find(root) == complex_values_.end()) {
            return std::nullopt;
        } else {
            values = complex_values_.at(root);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) return std::nullopt;
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        auto low = var_low % root->var_width();
        auto high = var_high % root->var_width();
        auto value = values[base];
        return (value >> low) & (~(0xFFFFFFFFFFFFFFFF << (high + 1)));
    } else {
        // function call
        if (var->is_function()) {
            // only built-in function that can be statically evaluated is supported
            auto const *func_call_car = reinterpret_cast<const FunctionCallVar *>(var);
            auto *def = func_call_car->func();
            if (def->is_builtin() && def->function_name() == "clog2") {
                auto arg = func_call_car->args().begin()->second;
                auto v = get_value_(arg.get());
                if (v) return clog2(*v);
            }
            return std::nullopt;

        } else {
            if (values_.find(var) == values_.end())
                return std::nullopt;
            else
                return values_.at(var);
        }
    }
}